

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::SizeStatistics::printTo(SizeStatistics *this,ostream *out)

{
  ostream *poVar1;
  string sStack_38;
  
  std::operator<<(out,"SizeStatistics(");
  std::operator<<(out,"unencoded_byte_array_data_bytes=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>(&sStack_38,&this->unencoded_byte_array_data_bytes);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"repetition_level_histogram=");
  if (((byte)this->__isset & 2) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>(&sStack_38,&this->repetition_level_histogram);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"definition_level_histogram=");
  if (((byte)this->__isset & 4) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>(&sStack_38,&this->definition_level_histogram);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void SizeStatistics::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "SizeStatistics(";
  out << "unencoded_byte_array_data_bytes="; (__isset.unencoded_byte_array_data_bytes ? (out << to_string(unencoded_byte_array_data_bytes)) : (out << "<null>"));
  out << ", " << "repetition_level_histogram="; (__isset.repetition_level_histogram ? (out << to_string(repetition_level_histogram)) : (out << "<null>"));
  out << ", " << "definition_level_histogram="; (__isset.definition_level_histogram ? (out << to_string(definition_level_histogram)) : (out << "<null>"));
  out << ")";
}